

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O2

int CfdGetConfidentialValueHex
              (void *handle,int64_t value_satoshi,bool ignore_version_info,char **value_hex)

{
  char *pcVar1;
  CfdException *this;
  string hex_str;
  ConfidentialValue value;
  Amount amount;
  string local_48 [32];
  
  cfd::Initialize();
  if (value_hex != (char **)0x0) {
    cfd::core::Amount::Amount(&amount,value_satoshi);
    cfd::core::ConfidentialValue::ConfidentialValue(&value,&amount);
    cfd::core::ConfidentialValue::GetHex_abi_cxx11_(&hex_str,&value);
    if (ignore_version_info) {
      std::__cxx11::string::substr((ulong)local_48,(ulong)&hex_str);
      std::__cxx11::string::operator=((string *)&hex_str,local_48);
      std::__cxx11::string::~string(local_48);
    }
    pcVar1 = cfd::capi::CreateString(&hex_str);
    *value_hex = pcVar1;
    std::__cxx11::string::~string((string *)&hex_str);
    cfd::core::ConfidentialValue::~ConfidentialValue(&value);
    return 0;
  }
  value._vptr_ConfidentialValue = (_func_int **)0x4fbb12;
  value.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8c2;
  value.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = "CfdGetConfidentialValueHex";
  cfd::core::logger::warn<>((CfdSourceLocation *)&value,"value_hex is null.");
  this = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&value,"Failed to parameter. value_hex is null.",(allocator *)&hex_str);
  cfd::core::CfdException::CfdException(this,kCfdIllegalArgumentError,(string *)&value);
  __cxa_throw(this,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetConfidentialValueHex(
    void* handle, int64_t value_satoshi, bool ignore_version_info,
    char** value_hex) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    if (value_hex == nullptr) {
      warn(CFD_LOG_SOURCE, "value_hex is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. value_hex is null.");
    }
    Amount amount(value_satoshi);
    ConfidentialValue value(amount);
    std::string hex_str = value.GetHex();

    if (ignore_version_info) {  // erase first 1byte (2 char)
      hex_str = hex_str.substr(2);
    }
    *value_hex = CreateString(hex_str);

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}